

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
ObjNoTest_UseFirstObjByDefault_Test::TestBody(ObjNoTest_UseFirstObjByDefault_Test *this)

{
  char ***pppcVar1;
  char *message;
  AssertHelper local_508;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_500;
  AssertionResult gtest_ar;
  SolverApp<TestSolver,_TestNLReader> app;
  
  mp::SolverApp<TestSolver,_TestNLReader>::SolverApp(&app);
  local_508.data_._0_4_ = 1;
  local_500.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       mp::SolverOptionManager::GetIntOption
                 (&app.solver_.super_Solver.super_BasicSolver.super_SolverOptionManager,"objno");
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&gtest_ar,"1","app.solver().GetIntOption(\"objno\")",(int *)&local_508,
             (longlong *)&local_500);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_500);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x685,message);
    testing::internal::AssertHelper::operator=(&local_508,(Message *)&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_500);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Args::Args((Args *)&gtest_ar,"test","testproblem",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
  ;
  pppcVar1 = Args::operator_cast_to_char___((Args *)&gtest_ar);
  mp::SolverApp<TestSolver,_TestNLReader>::Run(&app,*pppcVar1,0);
  Args::~Args((Args *)&gtest_ar);
  mp::SolverApp<TestSolver,_TestNLReader>::~SolverApp(&app);
  return;
}

Assistant:

TEST(ObjNoTest, UseFirstObjByDefault) {
  mp::SolverApp<TestSolver, TestNLReader> app;
  EXPECT_EQ(1, app.solver().GetIntOption("objno"));
  app.Run(Args("test", "testproblem"));
}